

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<DataStream,unsigned_char,XOnlyPubKey>
               (DataStream *s,uchar *args,XOnlyPubKey *args_1)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_writedata8<DataStream>(s,*args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    base_blob<256U>::Serialize<DataStream>((base_blob<256U> *)args_1,s);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}